

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Sequence::ArchiveOUT(ChFunction_Sequence *this,ChArchiveOut *marchive)

{
  ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_> local_48
  ;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Sequence>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->start;
  local_30._name = "start";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->functions;
  local_48._name = "functions";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Sequence::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Sequence>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(start);
    marchive << CHNVP(functions);
}